

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

int anon_unknown.dwarf_78740a::ParseStd(string *level)

{
  int iVar1;
  invalid_argument *anon_var_0;
  string *level_local;
  
  iVar1 = std::__cxx11::stoi(level,(size_t *)0x0,10);
  return iVar1;
}

Assistant:

int ParseStd(std::string const& level)
{
  try {
    return std::stoi(level);
  } catch (std::invalid_argument&) {
    // Fall through to use an invalid value.
  }
  return -1;
}